

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LWOMaterial.cpp
# Opt level: O2

bool __thiscall
Assimp::LWOImporter::HandleTextures
          (LWOImporter *this,aiMaterial *pcMat,TextureList *in,aiTextureType type)

{
  int iVar1;
  pointer pCVar2;
  ulong uVar3;
  byte bVar4;
  byte bVar5;
  aiTextureType aVar6;
  LWOImporter *this_00;
  ulong uVar7;
  bool bVar8;
  Logger *pLVar9;
  pointer pCVar10;
  uint uVar11;
  pointer pCVar12;
  _List_node_base *p_Var13;
  uint temp;
  undefined4 local_478;
  uint local_474;
  aiTextureType local_470;
  aiVector3D local_46c;
  LWOImporter *local_460;
  int mapping_;
  undefined4 uStack_454;
  ulong local_450;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_448;
  aiString s;
  
  local_470 = type;
  local_460 = this;
  if (pcMat == (aiMaterial *)0x0) {
    __assert_fail("__null != pcMat",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/LWO/LWOMaterial.cpp"
                  ,0x59,
                  "bool Assimp::LWOImporter::HandleTextures(aiMaterial *, const TextureList &, aiTextureType)"
                 );
  }
  temp = 0;
  s.length = 0;
  s.data[0] = '\0';
  memset(s.data + 1,0x1b,0x3ff);
  bVar8 = false;
  p_Var13 = (_List_node_base *)in;
  uVar11 = 0;
LAB_0040ee8b:
  do {
    p_Var13 = (((_List_base<Assimp::LWO::Texture,_std::allocator<Assimp::LWO::Texture>_> *)
               &p_Var13->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
    if (p_Var13 == (_List_node_base *)in) {
      return bVar8;
    }
  } while ((*(undefined1 *)((long)&p_Var13[6]._M_next + 4) != '\x01') ||
          (*(undefined1 *)((long)&p_Var13[6]._M_prev + 4) != '\x01'));
  switch(*(undefined4 *)&p_Var13[7]._M_next) {
  case 0:
    bVar5 = 0;
    local_478 = 4;
    local_474 = uVar11;
    break;
  case 1:
    bVar5 = 1;
    local_478 = 2;
    local_474 = uVar11;
    break;
  case 2:
    bVar4 = 1;
    bVar5 = 0;
    local_478 = 1;
    local_474 = uVar11;
    goto LAB_0040ef38;
  case 3:
    bVar5 = 0;
    local_478 = 3;
    local_474 = uVar11;
    break;
  case 4:
    local_474 = uVar11;
    pLVar9 = DefaultLogger::get();
    Logger::error(pLVar9,"LWO2: Unsupported texture mapping: FrontProjection");
    bVar5 = 0;
    local_478 = 5;
    break;
  case 5:
    goto switchD_0040eebf_caseD_5;
  default:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/LWO/LWOMaterial.cpp"
                  ,0x8a,
                  "bool Assimp::LWOImporter::HandleTextures(aiMaterial *, const TextureList &, aiTextureType)"
                 );
  }
  bVar4 = 0;
LAB_0040ef38:
  iVar1 = *(int *)((long)&p_Var13[7]._M_next + 4);
  if (iVar1 == 1) {
    local_46c.x = 0.0;
    local_46c.z = 0.0;
    local_46c.y = 1.0;
  }
  else if (iVar1 == 0) {
    local_46c.x = 1.0;
    local_46c.y = 0.0;
    local_46c.z = 0.0;
  }
  else {
    local_46c.x = 0.0;
    local_46c.y = 0.0;
    local_46c.z = 1.0;
  }
  aiMaterial::AddProperty(pcMat,&local_46c,1,"$tex.mapaxis",local_470,uVar11);
  if ((bool)(bVar5 | bVar4)) {
    _mapping_ = (pointer)0x0;
    local_448._M_allocated_capacity._0_4_ = 0;
    local_450 = CONCAT44((int)p_Var13[7]._M_prev,(int)((ulong)p_Var13[7]._M_prev >> 0x20));
    aiMaterial::AddProperty(pcMat,(aiUVTransform *)&mapping_,1,"$tex.uvtrafo",local_470,local_474);
  }
  pLVar9 = DefaultLogger::get();
  Logger::debug(pLVar9,"LWO2: Setting up non-UV mapping");
  goto LAB_0040efdf;
switchD_0040eebf_caseD_5:
  bVar8 = true;
  local_474 = uVar11;
  if (*(uint *)&p_Var13[6]._M_next != 0xffffffff) {
    temp = *(uint *)&p_Var13[6]._M_next;
    aiMaterial::AddProperty<int>(pcMat,(int *)&temp,1,"$tex.uvwsrc",local_470,uVar11);
    local_478 = 0;
LAB_0040efdf:
    this_00 = local_460;
    if (local_460->mIsLWO2 == true) {
      pCVar2 = (local_460->mClips).
               super__Vector_base<Assimp::LWO::Clip,_std::allocator<Assimp::LWO::Clip>_>._M_impl.
               super__Vector_impl_data._M_finish;
      temp = *(uint *)&p_Var13[3]._M_next;
      pCVar12 = pCVar2;
      for (pCVar10 = (local_460->mClips).
                     super__Vector_base<Assimp::LWO::Clip,_std::allocator<Assimp::LWO::Clip>_>.
                     _M_impl.super__Vector_impl_data._M_start; pCVar10 != pCVar2;
          pCVar10 = pCVar10 + 1) {
        if (pCVar10->idx == temp) {
          pCVar12 = pCVar10;
        }
      }
      if (pCVar12 == pCVar2) {
        pLVar9 = DefaultLogger::get();
        Logger::error(pLVar9,"LWO2: Clip index is out of bounds");
        temp = 0;
        aiString::Set(&s,"$texture.png");
        uVar11 = local_474;
      }
      else {
        if (pCVar12->type == UNSUPPORTED) {
          pLVar9 = DefaultLogger::get();
          Logger::error(pLVar9,"LWO2: Clip type is not supported");
          bVar8 = true;
          uVar11 = local_474;
          goto LAB_0040ee8b;
        }
        AdjustTexturePath(local_460,&pCVar12->path);
        uVar3 = (pCVar12->path)._M_string_length;
        if (uVar3 < 0x400) {
          s.length = (ai_uint32)uVar3;
          memcpy(s.data,(pCVar12->path)._M_dataplus._M_p,uVar3);
          s.data[uVar3] = '\0';
        }
        uVar11 = local_474;
        mapping_ = (uint)pCVar12->negate;
        aiMaterial::AddProperty(pcMat,&mapping_,1,"$tex.flags",local_470,local_474);
      }
    }
    else {
      std::__cxx11::string::string((string *)&mapping_,(string *)(p_Var13 + 1));
      uVar3 = local_450;
      if (local_450 == 0) {
        pLVar9 = DefaultLogger::get();
        Logger::warn(pLVar9,"LWOB: Empty file name");
      }
      else {
        AdjustTexturePath(this_00,(string *)&mapping_);
        uVar7 = local_450;
        if (local_450 < 0x400) {
          s.length = (ai_uint32)local_450;
          memcpy(s.data,_mapping_,local_450);
          s.data[uVar7] = '\0';
        }
      }
      std::__cxx11::string::~string((string *)&mapping_);
      bVar8 = true;
      uVar11 = local_474;
      if (uVar3 == 0) goto LAB_0040ee8b;
    }
    aVar6 = local_470;
    aiMaterial::AddProperty(pcMat,&s,"$tex.file",local_470,uVar11);
    aiMaterial::AddProperty<float>
              (pcMat,(float *)((long)&p_Var13[3]._M_next + 4),1,"$tex.blend",aVar6,uVar11);
    switch(*(undefined4 *)&p_Var13[6]._M_prev) {
    case 0:
    case 3:
      temp = 0;
      break;
    case 1:
    case 2:
      temp = 2;
      break;
    case 4:
      temp = 3;
      break;
    default:
      temp = 0;
      pLVar9 = DefaultLogger::get();
      Logger::warn(pLVar9,"LWO2: Unsupported texture blend mode: alpha or displacement");
      break;
    case 7:
      temp = 1;
    }
    aVar6 = local_470;
    uVar11 = local_474;
    aiMaterial::AddProperty<int>(pcMat,(int *)&temp,1,"$tex.op",local_470,local_474);
    mapping_ = local_478;
    aiMaterial::AddProperty<int>(pcMat,&mapping_,1,"$tex.mapping",aVar6,uVar11);
    temp = GetMapMode(*(Wrap *)&p_Var13[8]._M_next);
    aiMaterial::AddProperty<int>(pcMat,(int *)&temp,1,"$tex.mapmodeu",aVar6,uVar11);
    temp = GetMapMode(*(Wrap *)((long)&p_Var13[8]._M_next + 4));
    aiMaterial::AddProperty<int>(pcMat,(int *)&temp,1,"$tex.mapmodev",aVar6,uVar11);
    bVar8 = true;
    uVar11 = uVar11 + 1;
  }
  goto LAB_0040ee8b;
}

Assistant:

bool LWOImporter::HandleTextures(aiMaterial* pcMat, const TextureList& in, aiTextureType type)
{
    ai_assert(NULL != pcMat);

    unsigned int cur = 0, temp = 0;
    aiString s;
    bool ret = false;

    for (const auto &texture : in)    {
        if (!texture.enabled || !texture.bCanUse)
            continue;
        ret = true;

        // Convert lightwave's mapping modes to ours. We let them
        // as they are, the GenUVcoords step will compute UV
        // channels if they're not there.

        aiTextureMapping mapping;
        switch (texture.mapMode)
        {
            case LWO::Texture::Planar:
                mapping = aiTextureMapping_PLANE;
                break;
            case LWO::Texture::Cylindrical:
                mapping = aiTextureMapping_CYLINDER;
                break;
            case LWO::Texture::Spherical:
                mapping = aiTextureMapping_SPHERE;
                break;
            case LWO::Texture::Cubic:
                mapping = aiTextureMapping_BOX;
                break;
            case LWO::Texture::FrontProjection:
                ASSIMP_LOG_ERROR("LWO2: Unsupported texture mapping: FrontProjection");
                mapping = aiTextureMapping_OTHER;
                break;
            case LWO::Texture::UV:
                {
                    if( UINT_MAX == texture.mRealUVIndex ) {
                        // We have no UV index for this texture, so we can't display it
                        continue;
                    }

                    // add the UV source index
                    temp = texture.mRealUVIndex;
                    pcMat->AddProperty<int>((int*)&temp,1,AI_MATKEY_UVWSRC(type,cur));

                    mapping = aiTextureMapping_UV;
                }
                break;
            default:
                ai_assert(false);
        };

        if (mapping != aiTextureMapping_UV) {
            // Setup the main axis
            aiVector3D v;
            switch (texture.majorAxis) {
                case Texture::AXIS_X:
                    v = aiVector3D(1.0,0.0,0.0);
                    break;
                case Texture::AXIS_Y:
                    v = aiVector3D(0.0,1.0,0.0);
                    break;
                default: // case Texture::AXIS_Z:
                    v = aiVector3D(0.0,0.0,1.0);
                    break;
            }

            pcMat->AddProperty(&v,1,AI_MATKEY_TEXMAP_AXIS(type,cur));

            // Setup UV scalings for cylindric and spherical projections
            if (mapping == aiTextureMapping_CYLINDER || mapping == aiTextureMapping_SPHERE) {
                aiUVTransform trafo;
                trafo.mScaling.x = texture.wrapAmountW;
                trafo.mScaling.y = texture.wrapAmountH;

                static_assert(sizeof(aiUVTransform)/sizeof(ai_real) == 5, "sizeof(aiUVTransform)/sizeof(ai_real) == 5");
                pcMat->AddProperty(&trafo,1,AI_MATKEY_UVTRANSFORM(type,cur));
            }
            ASSIMP_LOG_DEBUG("LWO2: Setting up non-UV mapping");
        }

        // The older LWOB format does not use indirect references to clips.
        // The file name of a texture is directly specified in the tex chunk.
        if (mIsLWO2)    {
            // find the corresponding clip (take the last one if multiple
            // share the same index)
            ClipList::iterator end = mClips.end(), candidate = end;
            temp = texture.mClipIdx;
            for (ClipList::iterator clip = mClips.begin(); clip != end; ++clip) {
                if ((*clip).idx == temp) {
                    candidate = clip;
                }

            }
            if (candidate == end)   {
                ASSIMP_LOG_ERROR("LWO2: Clip index is out of bounds");
                temp = 0;

                // fixme: apparently some LWO files shipping with Doom3 don't
                // have clips at all ... check whether that's true or whether
                // it's a bug in the loader.

                s.Set("$texture.png");

                //continue;
            }
            else {
                if (Clip::UNSUPPORTED == (*candidate).type) {
                    ASSIMP_LOG_ERROR("LWO2: Clip type is not supported");
                    continue;
                }
                AdjustTexturePath((*candidate).path);
                s.Set((*candidate).path);

                // Additional image settings
                int flags = 0;
                if ((*candidate).negate) {
                    flags |= aiTextureFlags_Invert;
                }
                pcMat->AddProperty(&flags,1,AI_MATKEY_TEXFLAGS(type,cur));
            }
        }
        else
        {
            std::string ss = texture.mFileName;
            if (!ss.length()) {
                ASSIMP_LOG_WARN("LWOB: Empty file name");
                continue;
            }
            AdjustTexturePath(ss);
            s.Set(ss);
        }
        pcMat->AddProperty(&s,AI_MATKEY_TEXTURE(type,cur));

        // add the blend factor
        pcMat->AddProperty<float>(&texture.mStrength,1,AI_MATKEY_TEXBLEND(type,cur));

        // add the blend operation
        switch (texture.blendType)
        {
            case LWO::Texture::Normal:
            case LWO::Texture::Multiply:
                temp = (unsigned int)aiTextureOp_Multiply;
                break;

            case LWO::Texture::Subtractive:
            case LWO::Texture::Difference:
                temp = (unsigned int)aiTextureOp_Subtract;
                break;

            case LWO::Texture::Divide:
                temp = (unsigned int)aiTextureOp_Divide;
                break;

            case LWO::Texture::Additive:
                temp = (unsigned int)aiTextureOp_Add;
                break;

            default:
                temp = (unsigned int)aiTextureOp_Multiply;
                ASSIMP_LOG_WARN("LWO2: Unsupported texture blend mode: alpha or displacement");

        }
        // Setup texture operation
        pcMat->AddProperty<int>((int*)&temp,1,AI_MATKEY_TEXOP(type,cur));

        // setup the mapping mode
        int mapping_ = static_cast<int>(mapping);
        pcMat->AddProperty<int>(&mapping_, 1, AI_MATKEY_MAPPING(type, cur));

        // add the u-wrapping
        temp = (unsigned int)GetMapMode(texture.wrapModeWidth);
        pcMat->AddProperty<int>((int*)&temp,1,AI_MATKEY_MAPPINGMODE_U(type,cur));

        // add the v-wrapping
        temp = (unsigned int)GetMapMode(texture.wrapModeHeight);
        pcMat->AddProperty<int>((int*)&temp,1,AI_MATKEY_MAPPINGMODE_V(type,cur));

        ++cur;
    }
    return ret;
}